

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

int cJSON_strcasecmp(char *s1,char *s2)

{
  __int32_t *p_Var1;
  byte bVar2;
  uint uVar3;
  __int32_t **pp_Var4;
  long lVar5;
  byte bVar6;
  long lVar7;
  
  if (s1 == (char *)0x0) {
    uVar3 = (uint)(s2 != (char *)0x0);
  }
  else if (s2 == (char *)0x0) {
    uVar3 = 1;
  }
  else {
    pp_Var4 = __ctype_tolower_loc();
    p_Var1 = *pp_Var4;
    bVar2 = *s1;
    lVar5 = (long)(char)bVar2;
    bVar6 = *s2;
    if (p_Var1[lVar5] == p_Var1[(char)bVar6]) {
      lVar7 = 1;
      do {
        if ((char)lVar5 == '\0') {
          return 0;
        }
        bVar2 = s1[lVar7];
        lVar5 = (long)(char)bVar2;
        bVar6 = s2[lVar7];
        lVar7 = lVar7 + 1;
      } while (p_Var1[lVar5] == p_Var1[(char)bVar6]);
    }
    uVar3 = p_Var1[bVar2] - p_Var1[bVar6];
  }
  return uVar3;
}

Assistant:

static int cJSON_strcasecmp(const char *s1,const char *s2)
{
	if (!s1) return (s1==s2)?0:1;if (!s2) return 1;
	for(; tolower(*s1) == tolower(*s2); ++s1, ++s2)	if(*s1 == 0)	return 0;
	return tolower(*(const unsigned char *)s1) - tolower(*(const unsigned char *)s2);
}